

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::add_blocked_sample
          (TypedTimeSamples<std::array<float,_4UL>_> *this,double t)

{
  Sample local_30;
  
  local_30.blocked = true;
  local_30.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample>>
              *)this,&local_30);
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }